

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaeger_types.cpp
# Opt level: O1

void __thiscall jaegertracing::thrift::Tag::~Tag(Tag *this)

{
  ~Tag(this,&VTT);
  operator_delete(this);
  return;
}

Assistant:

Tag::~Tag() throw() {
}